

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void in_memory_snapshot_test(void)

{
  char *pcVar1;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  fdb_kvs_handle *in_stack_fffffffffffff968;
  fdb_file_handle *in_stack_fffffffffffff970;
  fdb_iterator *in_stack_fffffffffffff978;
  size_t in_stack_fffffffffffff990;
  fdb_doc **in_stack_fffffffffffff9e0;
  fdb_iterator *in_stack_fffffffffffff9e8;
  fdb_kvs_info *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_iterator *iterator;
  fdb_status status;
  fdb_kvs_info kvs_info;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_seqnum_t snap_seq;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int count;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fVar2 = fdb_open((fdb_file_handle **)fconfig._96_8_,(char *)fconfig.compaction_cb,
                   (fdb_config *)fconfig._80_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x3a3);
    in_memory_snapshot_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x3a3,"void in_memory_snapshot_test()");
    }
  }
  fVar2 = fdb_kvs_open_default
                    (in_stack_fffffffffffff970,(fdb_kvs_handle **)in_stack_fffffffffffff968,
                     (fdb_kvs_config *)0x10955d);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x3a5);
    in_memory_snapshot_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x3a5,"void in_memory_snapshot_test()");
    }
  }
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)fconfig._232_8_,
                            (fdb_kvs_handle **)fconfig.log_msg_level,
                            (fdb_seqnum_t)fconfig.breakpad_minidump_dir);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x3a9);
    in_memory_snapshot_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x3a9,"void in_memory_snapshot_test()");
    }
  }
  fdb_get_kvs_info((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                   in_stack_fffffffffffffad0);
  if (kvs_info.name != (char *)0x0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x3ac);
    in_memory_snapshot_test::__test_pass = 0;
    if (kvs_info.name != (char *)0x0) {
      __assert_fail("kvs_info.last_seqnum == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x3ac,"void in_memory_snapshot_test()");
    }
  }
  fdb_iterator_init((fdb_kvs_handle *)snap_seq,(fdb_iterator **)(keybuf + 0xf8),(void *)0x0,0,
                    (void *)0x0,0,0);
  fVar2 = fdb_iterator_get(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  if (fVar2 != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x3b1);
    in_memory_snapshot_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x3b1,"void in_memory_snapshot_test()");
    }
  }
  fdb_iterator_close(in_stack_fffffffffffff978);
  fdb_kvs_close(in_stack_fffffffffffff968);
  for (n = 0; n < 5; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar5 = (void *)0x10985d;
    sVar4 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                   (size_t)in_stack_fffffffffffff968,pvVar5,sVar4,(void *)0x109894,
                   in_stack_fffffffffffff990);
    fdb_set(snap_db,*(fdb_doc **)(&stack0xfffffffffffff968 + (long)n * 8));
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff968,'\0');
  for (; n < 9; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    in_stack_fffffffffffffad0 = (fdb_kvs_info *)&fconfig.num_blocks_readahead;
    pvVar5 = (void *)0x1099b0;
    sVar4 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                   (size_t)in_stack_fffffffffffff968,pvVar5,sVar4,(void *)0x1099e7,
                   in_stack_fffffffffffff990);
    fdb_set(snap_db,*(fdb_doc **)(&stack0xfffffffffffff968 + (long)n * 8));
  }
  iVar3 = n;
  sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
  sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
  sprintf((char *)&fconfig.num_blocks_readahead,"Body%d",(ulong)(uint)n);
  strlen(metabuf + 0xf8);
  strlen(bodybuf + 0xf8);
  pvVar5 = (void *)0x109ace;
  sVar4 = strlen((char *)&fconfig.num_blocks_readahead);
  fdb_doc_create((fdb_doc **)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                 (size_t)in_stack_fffffffffffff968,pvVar5,sVar4,(void *)0x109b05,
                 in_stack_fffffffffffff990);
  fdb_set(snap_db,*(fdb_doc **)(&stack0xfffffffffffff968 + (long)n * 8));
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff968,'\0');
  **(undefined1 **)(*(long *)(&stack0xfffffffffffff968 + (long)n * 8) + 0x40) = 0x62;
  fdb_set(snap_db,*(fdb_doc **)(&stack0xfffffffffffff968 + (long)n * 8));
  pcVar1 = *(char **)(*(long *)(&stack0xfffffffffffff968 + (long)n * 8) + 0x28);
  fdb_get_kvs_info((fdb_kvs_handle *)CONCAT44(iVar3,in_stack_fffffffffffffad8),
                   in_stack_fffffffffffffad0);
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)fconfig._232_8_,
                            (fdb_kvs_handle **)fconfig.log_msg_level,
                            (fdb_seqnum_t)fconfig.breakpad_minidump_dir);
  if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x3e5);
    in_memory_snapshot_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) {
      __assert_fail("status == FDB_RESULT_NO_DB_INSTANCE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x3e5,"void in_memory_snapshot_test()");
    }
  }
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)fconfig._232_8_,
                            (fdb_kvs_handle **)fconfig.log_msg_level,
                            (fdb_seqnum_t)fconfig.breakpad_minidump_dir);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x3eb);
    in_memory_snapshot_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x3eb,"void in_memory_snapshot_test()");
    }
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff968,'\0');
  fdb_set(snap_db,*(fdb_doc **)(&stack0xfffffffffffff968 + (long)n * 8));
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff968,'\0');
  while (n = n + 1, n < 0xf) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar5 = (void *)0x109da2;
    sVar4 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                   (size_t)in_stack_fffffffffffff968,pvVar5,sVar4,(void *)0x109dd9,
                   in_stack_fffffffffffff990);
    fdb_set(snap_db,*(fdb_doc **)(&stack0xfffffffffffff968 + (long)n * 8));
  }
  fVar2 = fdb_set_log_callback(snap_db,logCallbackFunc,"in_memory_snapshot_test");
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x402);
    in_memory_snapshot_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x402,"void in_memory_snapshot_test()");
    }
  }
  fdb_get_kvs_info((fdb_kvs_handle *)CONCAT44(iVar3,in_stack_fffffffffffffad8),
                   in_stack_fffffffffffffad0);
  if (kvs_info.name != pcVar1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x406);
    in_memory_snapshot_test::__test_pass = 0;
    if (kvs_info.name != pcVar1) {
      __assert_fail("kvs_info.last_seqnum == snap_seq",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x406,"void in_memory_snapshot_test()");
    }
  }
  for (; n < 0x14; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar5 = (void *)0x109fc9;
    sVar4 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                   (size_t)in_stack_fffffffffffff968,pvVar5,sVar4,(void *)0x10a000,
                   in_stack_fffffffffffff990);
    fdb_set(snap_db,*(fdb_doc **)(&stack0xfffffffffffff968 + (long)n * 8));
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff968,'\0');
  fdb_iterator_init((fdb_kvs_handle *)snap_seq,(fdb_iterator **)(keybuf + 0xf8),(void *)0x0,0,
                    (void *)0x0,0,0);
  n = 0;
  dbfile._0_4_ = 0;
  while( true ) {
    fVar2 = fdb_iterator_get(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x41d);
      in_memory_snapshot_test::__test_pass = 0;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x41d,"void in_memory_snapshot_test()");
      }
    }
    iVar3 = memcmp(pvRam0000000000000020,
                   *(void **)(*(long *)(&stack0xfffffffffffff968 + (long)n * 8) + 0x20),
                   sRam0000000000000000);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)(*(long *)(&stack0xfffffffffffff968 + (long)n * 8) + 0x20),
              pvRam0000000000000020,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x41f);
      in_memory_snapshot_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x41f,"void in_memory_snapshot_test()");
    }
    iVar3 = memcmp(pvRam0000000000000038,
                   *(void **)(*(long *)(&stack0xfffffffffffff968 + (long)n * 8) + 0x38),
                   sRam0000000000000008);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)(*(long *)(&stack0xfffffffffffff968 + (long)n * 8) + 0x38),
              pvRam0000000000000038,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x420);
      in_memory_snapshot_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x420,"void in_memory_snapshot_test()");
    }
    iVar3 = memcmp(pvRam0000000000000040,
                   *(void **)(*(long *)(&stack0xfffffffffffff968 + (long)n * 8) + 0x40),
                   sRam0000000000000010);
    if (iVar3 != 0) break;
    fdb_doc_free((fdb_doc *)0x10a2e1);
    n = n + 1;
    dbfile._0_4_ = (int)dbfile + 1;
    fVar2 = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffff968);
    if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
      if ((int)dbfile != 10) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x429);
        in_memory_snapshot_test::__test_pass = 0;
        if ((int)dbfile != 10) {
          __assert_fail("count==n/2",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x429,"void in_memory_snapshot_test()");
        }
      }
      fdb_iterator_close(in_stack_fffffffffffff978);
      fdb_kvs_close(in_stack_fffffffffffff968);
      fdb_kvs_close(in_stack_fffffffffffff968);
      fdb_close((fdb_file_handle *)in_stack_fffffffffffff968);
      for (n = 0; n < 0x14; n = n + 1) {
        fdb_doc_free((fdb_doc *)0x10a3ee);
      }
      fdb_shutdown();
      memleak_end();
      if (in_memory_snapshot_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","in-memory snapshot test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","in-memory snapshot test");
      }
      return;
    }
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
          *(undefined8 *)(*(long *)(&stack0xfffffffffffff968 + (long)n * 8) + 0x40),
          pvRam0000000000000040,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x421);
  in_memory_snapshot_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x421,"void in_memory_snapshot_test()");
}

Assistant:

void in_memory_snapshot_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int count;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_seqnum_t snap_seq;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_kvs_info kvs_info;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    status = fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create a snapshot from an empty database file
    status = fdb_snapshot_open(db, &snap_db, 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // check if snapshot's sequence number is zero.
    fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == 0);
    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    // Iterator should not return any items.
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);
    fdb_kvs_close(snap_db);

    // ------- Setup test ----------------------------------
    // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 8
    for (; i < n/2 - 1; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // We want to create:
    // |WALFlushHDR|Key-Value1|HDR|Key-Value2|SnapshotHDR|Key-Value1|HDR|
    // Insert doc 9 with a different value to test duplicate elimination..
    sprintf(keybuf, "key%d", i);
    sprintf(metabuf, "meta%d", i);
    sprintf(bodybuf, "Body%d", i);
    fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc[i]);

    // commit again without a WAL flush (last doc goes into the AVL tree)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Insert doc 9 now again with expected value..
    *(char *)doc[i]->body = 'b';
    fdb_set(db, doc[i]);

    // TAKE SNAPSHOT: pick up sequence number of a commit without a WAL flush
    snap_seq = doc[i]->seqnum;

    // Creation of a snapshot with a sequence number that was taken WITHOUT a
    // commit must fail even if it from the latest document that was set...
    fdb_get_kvs_info(db, &kvs_info);
    status = fdb_snapshot_open(db, &snap_db, kvs_info.last_seqnum);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    // ---------- Snapshot tests begin -----------------------
    // Initialize an in-memory snapshot Without a Commit...
    // WAL items are not flushed...
    status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit again without a WAL flush (these documents go into the AVL trees)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Now re-insert doc 9 as another duplicate (only newer sequence number)
    fdb_set(db, doc[i]);

    // commit again without a WAL flush (last doc goes into the AVL tree)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (++i; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "in_memory_snapshot_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check snapshot's sequence number
    fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == snap_seq);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without a WAL flush (This WAL must not affect snapshot)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // repeat until fail
    i=0;
    count=0;
    rdoc = NULL;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    TEST_CHK(count==n/2); // Only unique items from the first half

    fdb_iterator_close(iterator);

    // close db handle
    fdb_kvs_close(db);
    // close snapshot handle
    fdb_kvs_close(snap_db);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("in-memory snapshot test");
}